

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::AllExtensionsSupported
          (LocalAccessChainConvertPass *this)

{
  Module *pMVar1;
  Instruction *pIVar2;
  bool bVar3;
  FeatureManager *pFVar4;
  Operand *pOVar5;
  const_iterator cVar6;
  Instruction **ppIVar7;
  string extName;
  string local_50;
  
  pFVar4 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
  bVar3 = EnumSet<spv::Capability>::contains(&pFVar4->capabilities_,CapabilityVariablePointers);
  if (!bVar3) {
    pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    ppIVar7 = (Instruction **)
              ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    do {
      pIVar2 = *ppIVar7;
      if (pIVar2 == (Instruction *)
                    ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> +
                    8U)) {
        pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
        ppIVar7 = (Instruction **)
                  ((long)&(pMVar1->ext_inst_imports_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        while( true ) {
          pIVar2 = *ppIVar7;
          if (pIVar2 == (Instruction *)
                        ((long)&(pMVar1->ext_inst_imports_).
                                super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
            return true;
          }
          if (pIVar2->opcode_ != OpExtInstImport) break;
          pOVar5 = Instruction::GetInOperand(pIVar2,0);
          Operand::AsString_abi_cxx11_(&local_50,pOVar5);
          bVar3 = utils::starts_with(&local_50,"NonSemantic.");
          if ((bVar3) &&
             (bVar3 = std::operator!=(&local_50,"NonSemantic.Shader.DebugInfo.100"), bVar3)) {
            std::__cxx11::string::_M_dispose();
            return false;
          }
          std::__cxx11::string::_M_dispose();
          ppIVar7 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        }
        __assert_fail("inst.opcode() == spv::Op::OpExtInstImport && \"Expecting an import of an extension\'s instruction set.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp"
                      ,0x16a,
                      "bool spvtools::opt::LocalAccessChainConvertPass::AllExtensionsSupported() const"
                     );
      }
      pOVar5 = Instruction::GetInOperand(pIVar2,0);
      Operand::AsString_abi_cxx11_(&local_50,pOVar5);
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->extensions_allowlist_)._M_h,&local_50);
      std::__cxx11::string::_M_dispose();
      ppIVar7 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (cVar6.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur != (__node_type *)0x0);
  }
  return false;
}

Assistant:

bool LocalAccessChainConvertPass::AllExtensionsSupported() const {
  // This capability can now exist without the extension, so we have to check
  // for the capability.  This pass is only looking at function scope symbols,
  // so we do not care if there are variable pointers on storage buffers.
  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::VariablePointers))
    return false;
  // If any extension not in allowlist, return false
  for (auto& ei : get_module()->extensions()) {
    const std::string extName = ei.GetInOperand(0).AsString();
    if (extensions_allowlist_.find(extName) == extensions_allowlist_.end())
      return false;
  }
  // only allow NonSemantic.Shader.DebugInfo.100, we cannot safely optimise
  // around unknown extended
  // instruction sets even if they are non-semantic
  for (auto& inst : context()->module()->ext_inst_imports()) {
    assert(inst.opcode() == spv::Op::OpExtInstImport &&
           "Expecting an import of an extension's instruction set.");
    const std::string extension_name = inst.GetInOperand(0).AsString();
    if (spvtools::utils::starts_with(extension_name, "NonSemantic.") &&
        extension_name != "NonSemantic.Shader.DebugInfo.100") {
      return false;
    }
  }
  return true;
}